

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O1

bool duckdb::FromDecimalCast<signed_char>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  PhysicalType PVar1;
  InternalException *this;
  uint8_t uVar2;
  string local_50;
  
  uVar2 = DecimalType::GetWidth(&source->type);
  local_50.field_2._M_local_buf[9] = DecimalType::GetScale(&source->type);
  PVar1 = (source->type).physical_type_;
  local_50._M_dataplus._M_p = (pointer)result;
  local_50._M_string_length = (size_type)parameters;
  local_50.field_2._M_local_buf[8] = uVar2;
  if (PVar1 < INT64) {
    if (PVar1 == INT16) {
      local_50.field_2._M_local_buf[0] = '\x01';
      UnaryExecutor::
      ExecuteStandard<short,signed_char,duckdb::GenericUnaryWrapper,duckdb::VectorDecimalCastOperator<duckdb::TryCastFromDecimal>>
                (source,result,count,&local_50,parameters->error_message != (string *)0x0,
                 CAN_THROW_RUNTIME_ERROR);
    }
    else {
      if (PVar1 != INT32) {
LAB_012d72ab:
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Unimplemented internal type for decimal","");
        InternalException::InternalException(this,&local_50);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_50.field_2._M_local_buf[0] = '\x01';
      UnaryExecutor::
      ExecuteStandard<int,signed_char,duckdb::GenericUnaryWrapper,duckdb::VectorDecimalCastOperator<duckdb::TryCastFromDecimal>>
                (source,result,count,&local_50,parameters->error_message != (string *)0x0,
                 CAN_THROW_RUNTIME_ERROR);
    }
  }
  else if (PVar1 == INT64) {
    local_50.field_2._M_local_buf[0] = '\x01';
    UnaryExecutor::
    ExecuteStandard<long,signed_char,duckdb::GenericUnaryWrapper,duckdb::VectorDecimalCastOperator<duckdb::TryCastFromDecimal>>
              (source,result,count,&local_50,parameters->error_message != (string *)0x0,
               CAN_THROW_RUNTIME_ERROR);
  }
  else {
    if (PVar1 != INT128) goto LAB_012d72ab;
    local_50.field_2._M_local_buf[0] = '\x01';
    UnaryExecutor::
    ExecuteStandard<duckdb::hugeint_t,signed_char,duckdb::GenericUnaryWrapper,duckdb::VectorDecimalCastOperator<duckdb::TryCastFromDecimal>>
              (source,result,count,&local_50,parameters->error_message != (string *)0x0,
               CAN_THROW_RUNTIME_ERROR);
  }
  return (bool)local_50.field_2._M_local_buf[0];
}

Assistant:

static bool FromDecimalCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &source_type = source.GetType();
	auto width = DecimalType::GetWidth(source_type);
	auto scale = DecimalType::GetScale(source_type);
	switch (source_type.InternalType()) {
	case PhysicalType::INT16:
		return VectorCastHelpers::TemplatedDecimalCast<int16_t, T, TryCastFromDecimal>(source, result, count,
		                                                                               parameters, width, scale);
	case PhysicalType::INT32:
		return VectorCastHelpers::TemplatedDecimalCast<int32_t, T, TryCastFromDecimal>(source, result, count,
		                                                                               parameters, width, scale);
	case PhysicalType::INT64:
		return VectorCastHelpers::TemplatedDecimalCast<int64_t, T, TryCastFromDecimal>(source, result, count,
		                                                                               parameters, width, scale);
	case PhysicalType::INT128:
		return VectorCastHelpers::TemplatedDecimalCast<hugeint_t, T, TryCastFromDecimal>(source, result, count,
		                                                                                 parameters, width, scale);
	default:
		throw InternalException("Unimplemented internal type for decimal");
	}
}